

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall asl::Array<asl::String>::free(Array<asl::String> *this,void *__ptr)

{
  asl_destroy<asl::String>(this->_a,*(int *)&this->_a[-1].field_2);
  ::free(&this->_a[-1].field_2);
  this->_a = (String *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}